

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O2

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
additiveExpression(Tokenizer *tokenizer)

{
  _Head_base<0UL,_ExpressionInternal_*,_false> __p;
  Token *pTVar1;
  Tokenizer *in_RSI;
  OperatorType op;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp2;
  undefined1 local_4c [4];
  undefined1 local_48 [16];
  _Head_base<0UL,_ExpressionInternal_*,_false> local_38;
  
  multiplicativeExpression((Tokenizer *)local_48);
  if ((ExpressionInternal *)local_48._0_8_ == (ExpressionInternal *)0x0) {
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
  }
  else {
    while( true ) {
      local_4c = (undefined1  [4])0x0;
      pTVar1 = Tokenizer::peekToken(in_RSI,0);
      if (pTVar1->type == Plus) {
        local_4c = (undefined1  [4])0x6;
      }
      else if (pTVar1->type == Minus) {
        local_4c = (undefined1  [4])0x7;
      }
      else if (local_4c == (undefined1  [4])0x0) {
        (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)local_48._0_8_;
        local_48._0_8_ = (ExpressionInternal *)0x0;
        goto LAB_0013e2ca;
      }
      Tokenizer::eatToken(in_RSI);
      multiplicativeExpression((Tokenizer *)(local_48 + 8));
      if ((_List_node_base *)local_48._8_8_ == (_List_node_base *)0x0) break;
      std::
      make_unique<ExpressionInternal,OperatorType&,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                ((OperatorType *)&local_38,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_4c,(unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                           *)local_48);
      __p._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (pointer)0x0;
      std::__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::reset
                ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_48,__p._M_head_impl);
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 &local_38);
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_48 + 8));
    }
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
               (local_48 + 8));
  }
LAB_0013e2ca:
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_48);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> additiveExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = multiplicativeExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	while (true)
	{
		OperatorType op = OperatorType::Invalid;
		switch (tokenizer.peekToken().type)
		{
		case TokenType::Plus:
			op = OperatorType::Add;
			break;
		case TokenType::Minus:
			op = OperatorType::Sub;
			break;
		default:
			break;
		}

		if (op == OperatorType::Invalid)
			break;

		tokenizer.eatToken();

		std::unique_ptr<ExpressionInternal> exp2 = multiplicativeExpression(tokenizer);
		if (exp2 == nullptr)
			return nullptr;

		exp = std::make_unique<ExpressionInternal>(op, std::move(exp), std::move(exp2));
	}

	return exp;
}